

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsAnyMouseDown(void)

{
  int local_1c;
  int n;
  ImGuiContext *g;
  
  local_1c = 0;
  while( true ) {
    if (4 < local_1c) {
      return false;
    }
    if (((GImGui->IO).MouseDown[local_1c] & 1U) != 0) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool ImGui::IsAnyMouseDown()
{
    ImGuiContext& g = *GImGui;
    for (int n = 0; n < IM_ARRAYSIZE(g.IO.MouseDown); n++)
        if (g.IO.MouseDown[n])
            return true;
    return false;
}